

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmatch.c
# Opt level: O0

int pmatch(char *p,char *s,uint len)

{
  char cVar1;
  char *pcVar2;
  uint local_24;
  char c;
  char *pcStack_20;
  uint len_local;
  char *s_local;
  char *p_local;
  
  local_24 = len;
  pcStack_20 = s;
  s_local = p;
  while( true ) {
    while( true ) {
      while( true ) {
        pcVar2 = s_local + 1;
        cVar1 = *s_local;
        if (cVar1 == '\0') {
          return (uint)((local_24 != 0 ^ 0xffU) & 1);
        }
        if (cVar1 != '*') break;
        if (*pcVar2 == '\0') {
          return 1;
        }
        while( true ) {
          if (local_24 == 0) {
            return 0;
          }
          s_local = pcVar2;
          if (*pcStack_20 == *pcVar2) break;
          pcStack_20 = pcStack_20 + 1;
          local_24 = local_24 - 1;
        }
      }
      if (cVar1 != '+') break;
      s_local = s_local + 2;
      if (*pcVar2 != *pcStack_20) {
        return 0;
      }
      while( true ) {
        if (local_24 == 0) {
          return 1;
        }
        if (*pcStack_20 != *pcVar2) break;
        pcStack_20 = pcStack_20 + 1;
        local_24 = local_24 - 1;
      }
    }
    if (local_24 == 0) break;
    if (*pcStack_20 != cVar1) {
      return 0;
    }
    pcStack_20 = pcStack_20 + 1;
    local_24 = local_24 - 1;
    s_local = pcVar2;
  }
  return 0;
}

Assistant:

int pmatch(const char *p, const char *s, unsigned int len) {
  for (;;) {
    char c =*p++;
    if (! c) return(! len);
    switch(c) {
    case '*':
      if (! (c =*p)) return(1);
      for (;;) {
        if (! len) return(0);
        if (*s == c) break;
        ++s; --len;
      }
      continue;
    case '+':
      if ((c =*p++) != *s) return(0);
      for (;;) {
        if (! len) return(1);
        if (*s != c) break;
        ++s; --len;
      }
      continue;
      /*
    case '?':
      if (*p == '?') {
        if (*s != '?') return(0);
        ++p;
      }
      ++s; --len;
      continue;
      */
    default:
      if (! len) return(0);
      if (*s != c) return(0);
      ++s; --len;
      continue;
    }
  }
  return(0);
}